

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

char * ImGui::GetKeyName(ImGuiKey key)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiKey in_EDI;
  ImGuiContext *g;
  ImGuiKey local_c;
  char *local_8;
  
  pIVar1 = GImGui;
  if (in_EDI == ImGuiKey_KeysData_OFFSET) {
    local_8 = "None";
  }
  else {
    bVar2 = IsLegacyKey(in_EDI);
    local_c = in_EDI;
    if (bVar2) {
      if ((pIVar1->IO).KeyMap[(int)in_EDI] == -1) {
        local_8 = "N/A";
        return local_8;
      }
      local_c = (pIVar1->IO).KeyMap[(int)in_EDI];
    }
    if ((local_c & ImGuiMod_Mask_) != ImGuiKey_KeysData_OFFSET) {
      local_c = ConvertSingleModFlagToKey(local_c);
    }
    bVar2 = IsNamedKey(local_c);
    if (bVar2) {
      local_8 = GKeyNames[(int)(local_c - ImGuiKey_NamedKey_BEGIN)];
    }
    else {
      local_8 = "Unknown";
    }
  }
  return local_8;
}

Assistant:

const char* ImGui::GetKeyName(ImGuiKey key)
{
    if (key == ImGuiKey_None)
        return "None";
#ifdef IMGUI_DISABLE_OBSOLETE_KEYIO
    IM_ASSERT(IsNamedKeyOrMod(key) && "Support for user key indices was dropped in favor of ImGuiKey. Please update backend and user code.");
#else
    ImGuiContext& g = *GImGui;
    if (IsLegacyKey(key))
    {
        if (g.IO.KeyMap[key] == -1)
            return "N/A";
        IM_ASSERT(IsNamedKey((ImGuiKey)g.IO.KeyMap[key]));
        key = (ImGuiKey)g.IO.KeyMap[key];
    }
#endif
    if (key & ImGuiMod_Mask_)
        key = ConvertSingleModFlagToKey(key);
    if (!IsNamedKey(key))
        return "Unknown";

    return GKeyNames[key - ImGuiKey_NamedKey_BEGIN];
}